

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Low_options>::insert_simplex_and_subfaces<std::initializer_list<unsigned_char>>
          (Simplex_tree<Low_options> *this,initializer_list<unsigned_char> *Nsimplex,
          Filtration_value *filtration)

{
  uchar uVar1;
  int iVar2;
  Filtration_value FVar3;
  uchar *__first;
  long lVar4;
  uchar *puVar5;
  Filtration_value *filt;
  int iVar6;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var7;
  undefined8 *puVar8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var9;
  const_iterator __position;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar10;
  
  FVar3 = filtration[1];
  if (FVar3 == 0.0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    __first = (uchar *)*filtration;
    if ((char)in_FS_OFFSET[-0x1d] == '\0') {
      in_FS_OFFSET[-0x1e] = 0;
      in_FS_OFFSET[-0x20] = 0;
      in_FS_OFFSET[-0x1f] = 0;
      __cxa_thread_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                          *in_FS_OFFSET + -0x100,&__dso_handle);
      *(undefined1 *)(in_FS_OFFSET + -0x1d) = 1;
    }
    lVar4 = *in_FS_OFFSET;
    puVar5 = (uchar *)in_FS_OFFSET[-0x20];
    __position._M_current = (uchar *)in_FS_OFFSET[-0x1f];
    if ((uchar *)in_FS_OFFSET[-0x1f] != puVar5) {
      in_FS_OFFSET[-0x1f] = (long)puVar5;
      __position._M_current = puVar5;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(lVar4 + -0x100),__position,
               __first,__first + (long)FVar3);
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (in_FS_OFFSET[-0x20],in_FS_OFFSET[-0x1f]);
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0x20],in_FS_OFFSET[-0x1f]);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar4 + -0x100),
               (const_iterator)_Var7._M_current,(uchar *)in_FS_OFFSET[-0x1f]);
    _Var7._M_current = (uchar *)in_FS_OFFSET[-0x20];
    filt = (Filtration_value *)in_FS_OFFSET[-0x1f];
    _Var9._M_current = _Var7._M_current;
    while ((Filtration_value *)_Var9._M_current != filt) {
      uVar1 = *_Var9._M_current;
      _Var9._M_current = (uchar *)((long)_Var9._M_current + 1);
      if (uVar1 == (uchar)Nsimplex[3]._M_len) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(puVar8,&char_const*::typeinfo,0);
      }
    }
    iVar6 = ~(uint)_Var7._M_current + (int)filt;
    iVar2 = (int)Nsimplex[8]._M_len;
    if (iVar6 < iVar2) {
      iVar6 = iVar2;
    }
    *(int *)&Nsimplex[8]._M_len = iVar6;
    pVar10 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )(Nsimplex + 4),_Var7,filt);
    filtration = pVar10._8_8_;
  }
  pVar10._8_8_ = filtration;
  pVar10.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar10;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }